

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.c
# Opt level: O0

void test_array_expand(void)

{
  undefined4 local_30;
  int local_2c;
  int elm;
  int i;
  cf_array_t arr;
  
  local_30 = 0x4d2;
  cf_array_init((cf_array_t *)&elm,4,5);
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    cf_array_insert((cf_array_t *)&elm,-1,&local_30,4);
  }
  if (arr.elm_size != 5) {
    __assert_fail("((&arr)->elm_count) == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                  ,0x15,"void test_array_expand()");
  }
  if (_elm != 5) {
    __assert_fail("arr.capacity == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                  ,0x16,"void test_array_expand()");
  }
  cf_array_insert((cf_array_t *)&elm,-1,&local_30,4);
  if (_elm == 10) {
    cf_array_deinit((cf_array_t *)&elm);
    return;
  }
  __assert_fail("arr.capacity == 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                ,0x18,"void test_array_expand()");
}

Assistant:

void test_array_expand() {
    cf_array_t arr;
    int i;
    int elm = 1234;
    cf_array_init(&arr, sizeof(int), 5);

    for (i = 0; i < 5; i++) {
        cf_array_insert(&arr, CF_ARRAY_END_INDEX, &elm, sizeof(int));
    }
    cf_assert(cf_array_size(&arr) == 5);
    cf_assert(arr.capacity == 5);
    cf_array_insert(&arr, CF_ARRAY_END_INDEX, &elm, sizeof(int));
    cf_assert(arr.capacity == 10);

    cf_array_deinit(&arr);
}